

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_39292::ParseBuildFileDelegate::cannotLoadDueToMultipleProducers
          (ParseBuildFileDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  Child *pCVar1;
  pointer pcVar2;
  Command *pCVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  string message;
  Child local_f0;
  undefined8 local_e8;
  Child local_e0;
  undefined8 uStack_d8;
  ulong *local_d0;
  ulong local_c8;
  ulong local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  pcVar2 = (output->name)._M_dataplus._M_p;
  local_90 = &local_80;
  if (pcVar2 == (pointer)0x0) {
    local_88 = 0;
    local_80 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar2,pcVar2 + (output->name)._M_string_length);
  }
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1c2f2c);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
    local_70 = (long *)*plVar4;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_c0 = *puVar7;
    uStack_b8 = (undefined4)plVar4[3];
    uStack_b4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar7;
    local_d0 = (ulong *)*plVar4;
  }
  local_c8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pCVar3 = *(commands->
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pCVar3->name)._M_dataplus._M_p;
  if (pcVar2 == (pointer)0x0) {
    local_b0 = &local_a0;
    local_a8 = 0;
    local_a0 = 0;
  }
  else {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,pcVar2,pcVar2 + (pCVar3->name)._M_string_length);
  }
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < local_a8 + local_c8) {
    uVar9 = 0xf;
    if (local_b0 != &local_a0) {
      uVar9 = CONCAT71(uStack_9f,local_a0);
    }
    if (local_a8 + local_c8 <= uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_d0);
      goto LAB_0011cd12;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0);
LAB_0011cd12:
  local_f0.twine = (Twine *)&local_e0;
  pCVar1 = (Child *)(puVar5 + 2);
  if ((Child *)*puVar5 == pCVar1) {
    local_e0 = (Child)pCVar1->twine;
    uStack_d8 = puVar5[3];
  }
  else {
    local_e0 = (Child)pCVar1->twine;
    local_f0.decUL = ((unsigned_long *)*puVar5).decUL;
  }
  local_e8 = puVar5[1];
  *puVar5 = pCVar1;
  puVar5[1] = 0;
  pCVar1->character = '\0';
  plVar4 = (long *)std::__cxx11::string::append(&local_f0.character);
  psVar8 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (&(local_f0.twine)->LHS != &local_e0) {
    operator_delete(local_f0.twine,(ulong)((long)&(local_e0.twine)->LHS + 1));
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  local_d0 = (ulong *)0x0;
  local_c8 = local_c8 & 0xffffffff00000000;
  llvm::Twine::Twine((Twine *)&local_f0,&local_50);
  (*(this->super_BuildFileDelegate)._vptr_BuildFileDelegate[5])(this,"",0,&local_d0,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
ParseBuildFileDelegate::cannotLoadDueToMultipleProducers(Node *output,
                                                         std::vector<Command*> commands) {
  std::string message = "cannot build '" + output->getName().str() + "' node is produced "
  "by multiple commands; e.g. '" + (*commands.begin())->getName().str() + "'";
  error("", {}, message);
}